

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ImGuiStoragePair *__dest;
  int iVar4;
  ulong uVar5;
  long lVar7;
  int iVar8;
  ImGuiStoragePair *pIVar9;
  long lVar10;
  ulong uVar6;
  
  iVar2 = (this->Data).Size;
  uVar3 = (ulong)iVar2;
  __dest = (this->Data).Data;
  uVar6 = uVar3;
  pIVar9 = __dest;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar6 >> 1;
      if (pIVar9[uVar5].key < key) {
        pIVar9 = pIVar9 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar6;
      }
      uVar6 = uVar5;
    } while (uVar5 != 0);
  }
  if ((pIVar9 == __dest + uVar3) || (pIVar9->key != key)) {
    lVar10 = (long)pIVar9 - (long)__dest;
    if (iVar2 == (this->Data).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar8 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar8 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar8 << 4,GImAllocatorUserData);
      pIVar9 = (this->Data).Data;
      if (pIVar9 != (ImGuiStoragePair *)0x0) {
        memcpy(__dest,pIVar9,(long)(this->Data).Size << 4);
        pIVar9 = (this->Data).Data;
        if ((pIVar9 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar8;
      uVar3 = (ulong)(this->Data).Size;
    }
    lVar7 = uVar3 - (lVar10 >> 4);
    if (lVar7 != 0 && lVar10 >> 4 <= (long)uVar3) {
      memmove((void *)((long)__dest + lVar10 + 0x10),(void *)((long)__dest + lVar10),lVar7 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar10) = key;
    *(void **)((long)__dest + lVar10 + 8) = val;
    (this->Data).Size = (this->Data).Size + 1;
  }
  else {
    (pIVar9->field_1).val_p = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_p = val;
}